

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int comma2semicolon(char *string)

{
  int iVar1;
  char **in_RDI;
  char *tstr;
  
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          if (*(char *)in_RDI == '\0') {
            return 0;
          }
          if (*(char *)in_RDI != ',') break;
          *(char *)in_RDI = ';';
          in_RDI = (char **)((long)in_RDI + 1);
        }
        if (*(char *)in_RDI != '(') break;
        in_RDI = (char **)((long)in_RDI + 1);
        iVar1 = find_paren(in_RDI);
        if (iVar1 != 0) {
          return 1;
        }
      }
      if (*(char *)in_RDI == '[') break;
      if (*(char *)in_RDI == '{') {
        in_RDI = (char **)((long)in_RDI + 1);
        iVar1 = find_curlybracket(in_RDI);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else if (*(char *)in_RDI == '\"') {
        in_RDI = (char **)((long)in_RDI + 1);
        iVar1 = find_doublequote((char **)&stack0xffffffffffffffe8);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else if (*(char *)in_RDI == '\'') {
        in_RDI = (char **)((long)in_RDI + 1);
        iVar1 = find_quote((char **)&stack0xffffffffffffffe8);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        in_RDI = (char **)((long)in_RDI + 1);
      }
    }
    in_RDI = (char **)((long)in_RDI + 1);
    iVar1 = find_bracket(in_RDI);
  } while (iVar1 == 0);
  return 1;
}

Assistant:

int comma2semicolon(char *string)

/*  
    replace commas with semicolons, unless the comma is within a quoted or bracketed expression 
*/
{
    char *tstr;

    tstr = string;

    while (*tstr) {

        if (*tstr == ',') { /* found a comma */
           *tstr = ';';
           tstr++;
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(0);  /* reached end of string */
}